

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpecsOf.hpp
# Opt level: O2

void __thiscall sciplot::TextSpecs::~TextSpecs(TextSpecs *this)

{
  ~TextSpecs(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TextSpecsOf<DerivedSpecs>::TextSpecsOf()
{
    enhanced(true);
    textColor(internal::DEFAULT_TEXTCOLOR);
}